

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

Symbol * ados_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  int iVar1;
  Symbol *pSVar2;
  Symbol *pSVar3;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  GlobalVars *unaff_retaddr;
  Symbol *sdabase;
  uint32_t in_stack_00000018;
  int i;
  Symbol *sym;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  GlobalVars *in_stack_ffffffffffffffc8;
  uint32_t local_2c;
  char *in_stack_fffffffffffffff8;
  
  if (*(int *)(in_RDI + 0x5c) == 0) {
    for (local_2c = 0; (int)local_2c < 0x12; local_2c = local_2c + 1) {
      iVar1 = strcmp(ados_symnames[(int)local_2c],*(char **)(in_RDX + 0x10));
      if (iVar1 == 0) {
        if ((local_2c != 6) && (local_2c != 7)) {
          uVar4 = 0;
          pSVar2 = addlnksymbol(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                                (uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                                (uint8_t)((ulong)in_RSI >> 0x28),(uint8_t)sdabase,in_stack_00000018)
          ;
          if (((((local_2c == 0) || (local_2c == 3)) || (local_2c == 4)) ||
              ((local_2c == 8 || (local_2c == 0x10)))) || (local_2c == 0x11)) {
            pSVar2->type = '\x02';
          }
          if ((((local_2c == 3) || (local_2c == 0)) || (local_2c == 8)) &&
             (pSVar3 = findlnksymbol(in_stack_ffffffffffffffc8,
                                     (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar4)),
             pSVar3 == (Symbol *)0x0)) {
            pSVar3 = addlnksymbol(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                                  (uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                                  (uint8_t)((ulong)in_RSI >> 0x28),(uint8_t)sdabase,
                                  in_stack_00000018);
            pSVar3->type = '\x02';
            pSVar3->extra = 0x10;
          }
          pSVar2->extra = local_2c;
          return pSVar2;
        }
        pSVar2 = findlnksymbol(in_stack_ffffffffffffffc8,
                               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                              );
        return pSVar2;
      }
    }
  }
  return (Symbol *)0x0;
}

Assistant:

static struct Symbol *ados_lnksym(struct GlobalVars *gv,struct Section *sec,
                                  struct Reloc *xref)
/* Checks, if undefined symbol is an ADOS-linker symbol */
{
  struct Symbol *sym;
  int i;

  if (!gv->dest_object) {
    for (i=0; i<=LAST_LNKSYM; i++) {
      if (!strcmp(ados_symnames[i],xref->xrefname)) {
        if (i==SASCT || i==SASDT) {
          /* map to ___CTOR_LIST__ / ___DTOR_LIST__ */
          return findlnksymbol(gv,(i == SASCT) ?
                                  "___CTOR_LIST__" : "___DTOR_LIST__");
        }
        else {
          sym = addlnksymbol(gv,ados_symnames[i],0,SYM_ABS,
                             SYMF_LNKSYM,SYMI_OBJECT,SYMB_GLOBAL,0);
          if (i==PHXDB || i==SASPT || i==SASBB || i==DICDB ||
              i==ELFSD || i==ELFS2) {
            sym->type = SYM_RELOC;
          }
          if ((i==SASPT || i==PHXDB || i==DICDB) &&
              findlnksymbol(gv,sdabase_name)==NULL) {
            /* Reference to _LinkerDB, _DATA_BAS_ or __DATA_BAS
               creates _SDA_BASE_ */
            struct Symbol *sdabase = addlnksymbol(gv,sdabase_name,0,SYM_ABS,
                                                  SYMF_LNKSYM,SYMI_OBJECT,
                                                  SYMB_GLOBAL,0);
            sdabase->type = SYM_RELOC;
            sdabase->extra = ELFSD;
          }
          sym->extra = i;  /* for easy identification in ados_setlnksym */
          return sym;  /* new linker symbol created */
        }
      }
    }
  }
  return NULL;
}